

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool ON_SubDEdgeChain::IsClosed(size_t edge_count,ON_SubDEdgePtr *edges)

{
  long lVar1;
  uint uVar2;
  size_t i;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  bool bVar6;
  
  if (edges != (ON_SubDEdgePtr *)0x0 && 2 < edge_count) {
    uVar3 = edges->m_ptr & 0xfffffffffffffff8;
    if (uVar3 != 0) {
      uVar2 = (uint)edges->m_ptr & 1;
      lVar1 = *(long *)(uVar3 + 0x80 + (ulong)uVar2 * 8);
      if (lVar1 != 0) {
        uVar5 = edges[edge_count - 1].m_ptr & 0xfffffffffffffff8;
        if ((uVar5 != 0) &&
           (lVar1 == *(long *)(uVar5 + 0x80 + (ulong)(~(uint)edges[edge_count - 1].m_ptr & 1) * 8)))
        {
          plVar4 = (long *)(uVar3 + 0x80 + (ulong)(uVar2 ^ 1) * 8);
          uVar3 = 1;
          while( true ) {
            bVar6 = edge_count <= uVar3;
            if (bVar6) {
              return bVar6;
            }
            if (*plVar4 == 0) {
              return bVar6;
            }
            uVar5 = edges[uVar3].m_ptr & 0xfffffffffffffff8;
            if ((uVar5 == 0) ||
               (uVar2 = (uint)edges[uVar3].m_ptr & 1,
               *plVar4 != *(long *)(uVar5 + 0x80 + (ulong)uVar2 * 8))) break;
            plVar4 = (long *)(uVar5 + 0x80 + (ulong)(uVar2 ^ 1) * 8);
            uVar3 = uVar3 + 1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdgeChain::IsClosed(
  size_t edge_count,
  const ON_SubDEdgePtr* edges
)
{
  if (edge_count < 3 || nullptr == edges)
    return false;
  const ON_SubDVertex* v = edges[0].RelativeVertex(0);
  if (nullptr == v)
    return false;
  if (v != edges[edge_count - 1].RelativeVertex(1))
    return false;

  v = edges[0].RelativeVertex(1);
  for (size_t i = 1; i < edge_count; ++i)
  {
    if (nullptr == v)
      return false;
    if (v != edges[i].RelativeVertex(0))
      return false;
    v = edges[i].RelativeVertex(1);
  }

  return true;

}